

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForEnum
          (Generator *this,EnumDescriptor *enum_descriptor)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  string value_options;
  string enum_options;
  string descriptor_name;
  string local_d8;
  Generator *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b8 = this;
  ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>(&local_50,this,enum_descriptor);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"EnumOptions","");
  MessageLite::SerializeAsString_abi_cxx11_(&local_d8,*(MessageLite **)(enum_descriptor + 0x20));
  OptionsValue(&local_70,local_b8,&local_b0,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_70);
  if (iVar2 != 0) {
    io::Printer::Print(local_b8->printer_,
                       "$descriptor$.has_options = True\n$descriptor$._options = $options$\n",
                       "descriptor",&local_50,"options",&local_70);
  }
  if (0 < *(int *)(enum_descriptor + 0x2c)) {
    lVar4 = 0x20;
    lVar3 = 0;
    do {
      lVar1 = *(long *)(enum_descriptor + 0x30);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"EnumValueOptions","");
      MessageLite::SerializeAsString_abi_cxx11_(&local_90,*(MessageLite **)(lVar1 + lVar4));
      OptionsValue(&local_b0,local_b8,&local_d8,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_b0);
      if (iVar2 != 0) {
        StringPrintf_abi_cxx11_
                  (&local_d8,"%s.values_by_name[\"%s\"]",local_50._M_dataplus._M_p,
                   **(undefined8 **)(lVar1 + -0x20 + lVar4));
        io::Printer::Print(local_b8->printer_,
                           "$descriptor$.has_options = True\n$descriptor$._options = $options$\n",
                           "descriptor",&local_d8,"options",&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x28;
    } while (lVar3 < *(int *)(enum_descriptor + 0x2c));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Generator::FixOptionsForEnum(const EnumDescriptor& enum_descriptor) const {
  string descriptor_name = ModuleLevelDescriptorName(enum_descriptor);
  string enum_options = OptionsValue(
      "EnumOptions", enum_descriptor.options().SerializeAsString());
  if (enum_options != "None") {
    PrintDescriptorOptionsFixingCode(descriptor_name, enum_options, printer_);
  }
  for (int i = 0; i < enum_descriptor.value_count(); ++i) {
    const EnumValueDescriptor& value_descriptor = *enum_descriptor.value(i);
    string value_options = OptionsValue(
        "EnumValueOptions", value_descriptor.options().SerializeAsString());
    if (value_options != "None") {
      PrintDescriptorOptionsFixingCode(
          StringPrintf("%s.values_by_name[\"%s\"]", descriptor_name.c_str(),
                       value_descriptor.name().c_str()),
          value_options, printer_);
    }
  }
}